

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O1

int setcasefold(int f,int n)

{
  char *fmt;
  bool bVar1;
  
  bVar1 = (f & 7U) == 0;
  fmt = "Case-fold-search unset";
  if (bVar1) {
    fmt = "Case-fold-search set";
  }
  casefoldsearch = (int)bVar1;
  ewprintf(fmt);
  re_pat[0] = '\0';
  return 1;
}

Assistant:

int
setcasefold(int f, int n)
{
	if (f & FFARG) {
		casefoldsearch = FALSE;
		ewprintf("Case-fold-search unset");
	} else {
		casefoldsearch = TRUE;
		ewprintf("Case-fold-search set");
	}

	/*
	 * Invalidate the regular expression pattern since I'm too lazy to
	 * recompile it.
	 */
	re_pat[0] = '\0';
	return (TRUE);
}